

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_test.cc
# Opt level: O1

void test_function_4ms(void)

{
  LatencyCollector *_lat;
  int iVar1;
  int *piVar2;
  LatencyCollectWrapper LCW__func_latency__;
  string local_48;
  LatencyCollectWrapper local_28;
  
  _lat = global_lat;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"test_function_4ms","");
  LatencyCollectWrapper::LatencyCollectWrapper(&local_28,_lat,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48._M_dataplus._M_p = (pointer)0x0;
  local_48._M_string_length = 3000000;
  do {
    iVar1 = nanosleep((timespec *)&local_48,(timespec *)&local_48);
    if (iVar1 != -1) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  inner_function();
  LatencyCollectWrapper::~LatencyCollectWrapper(&local_28);
  return;
}

Assistant:

void test_function_4ms() {
    collectFuncLatency(global_lat);
    std::this_thread::sleep_for(std::chrono::milliseconds(3));
    inner_function();
}